

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wall_timer_options.h
# Opt level: O0

void __thiscall miniros::WallTimerOptions::~WallTimerOptions(WallTimerOptions *this)

{
  std::shared_ptr<const_void>::~shared_ptr((shared_ptr<const_void> *)0x47cfdc);
  std::function<void_(const_miniros::WallTimerEvent_&)>::~function
            ((function<void_(const_miniros::WallTimerEvent_&)> *)0x47cfea);
  WallDuration::~WallDuration((WallDuration *)0x47cff4);
  return;
}

Assistant:

struct MINIROS_DECL WallTimerOptions
{
  WallTimerOptions()
  : period(0.1)
  , callback_queue(0)
  , oneshot(false)
  , autostart(true)
  {
  }

  /*
   * \brief Constructor
   * \param
   */
  WallTimerOptions(WallDuration _period, const WallTimerCallback& _callback, CallbackQueueInterface* _queue, 
                   bool oneshot = false, bool autostart = true)
  : period(_period)
  , callback(_callback)
  , callback_queue(_queue)
  , oneshot(oneshot)
  , autostart(autostart)
  {}

  WallDuration period;                                              ///< The period to call the callback at
  WallTimerCallback callback;                                       ///< The callback to call

  CallbackQueueInterface* callback_queue;                           ///< Queue to add callbacks to.  If NULL, the global callback queue will be used

  /**
   * A shared pointer to an object to track for these callbacks.  If set, the a weak_ptr will be created to this object,
   * and if the reference count goes to 0 the subscriber callbacks will not get called.
   *
   * \note Note that setting this will cause a new reference to be added to the object before the
   * callback, and for it to go out of scope (and potentially be deleted) in the code path (and therefore
   * thread) that the callback is invoked from.
   */
  VoidConstPtr tracked_object;

  bool oneshot;
  bool autostart;
}